

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgDreamEnumerates.hpp
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
* TasDREAM::IO::getStringRuleMap_abi_cxx11_(void)

{
  long lVar1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  *in_RDI;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>
  __l;
  allocator_type local_156;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_155;
  TypeDistribution local_154 [7];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_110;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_c0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_98;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  local_48;
  
  local_154[6] = 6;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[5],_TasDREAM::TypeDistribution,_true>
            (&local_138,(char (*) [5])"null",local_154 + 6);
  local_154[5] = 5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[5],_TasDREAM::TypeDistribution,_true>
            (&local_110,(char (*) [5])"none",local_154 + 5);
  local_154[4] = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[8],_TasDREAM::TypeDistribution,_true>
            (&local_e8,(char (*) [8])"uniform",local_154 + 4);
  local_154[3] = 1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[9],_TasDREAM::TypeDistribution,_true>
            (&local_c0,(char (*) [9])"gaussian",local_154 + 3);
  local_154[2] = 2;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[12],_TasDREAM::TypeDistribution,_true>
            (&local_98,(char (*) [12])"exponential",local_154 + 2);
  local_154[1] = 3;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[5],_TasDREAM::TypeDistribution,_true>
            (&local_70,(char (*) [5])"beta",local_154 + 1);
  local_154[0] = dist_gamma;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>
  ::pair<const_char_(&)[6],_TasDREAM::TypeDistribution,_true>
            (&local_48,(char (*) [6])"gamma",local_154);
  __l._M_len = 7;
  __l._M_array = &local_138;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TasDREAM::TypeDistribution>_>_>
  ::map(in_RDI,__l,&local_155,&local_156);
  lVar1 = 0xf0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_138.first._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x28;
  } while (lVar1 != -0x28);
  return in_RDI;
}

Assistant:

inline std::map<std::string, TypeDistribution> getStringRuleMap(){
        return std::initializer_list<std::pair<std::string const, TypeDistribution>>{
            {"null",        dist_null},
            {"none",        dist_none},
            {"uniform",     dist_uniform},
            {"gaussian",    dist_gaussian},
            {"exponential", dist_exponential},
            {"beta",        dist_beta},
            {"gamma",       dist_gamma}};
    }